

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppendGrow(sqlite3 *db,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  int *piVar2;
  undefined8 in_RDX;
  long in_RSI;
  ExprList *pNew;
  ExprList_item *pItem;
  Expr *in_stack_ffffffffffffffc8;
  sqlite3 *local_8;
  
  *(int *)(in_RSI + 4) = *(int *)(in_RSI + 4) << 1;
  local_8 = (sqlite3 *)
            sqlite3DbRealloc((sqlite3 *)&DAT_aaaaaaaaaaaaaaaa,&DAT_aaaaaaaaaaaaaaaa,
                             (u64)in_stack_ffffffffffffffc8);
  if (local_8 == (sqlite3 *)0x0) {
    sqlite3ExprListDelete((sqlite3 *)0x0,(ExprList *)in_stack_ffffffffffffffc8);
    sqlite3ExprDelete(local_8,in_stack_ffffffffffffffc8);
    local_8 = (sqlite3 *)0x0;
  }
  else {
    iVar1 = *(int *)&local_8->pVfs;
    *(int *)&local_8->pVfs = iVar1 + 1;
    piVar2 = local_8->aLimit + (long)iVar1 * 6 + -0x20;
    *(Expr **)piVar2 = (Expr *)0x0;
    *(char **)(piVar2 + 2) = (char *)0x0;
    piVar2[4] = 0;
    piVar2[5] = 0;
    *(undefined8 *)piVar2 = in_RDX;
  }
  return (ExprList *)local_8;
}

Assistant:

ExprList *sqlite3ExprListAppendGrow(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pNew;
  pList->nAlloc *= 2;
  pNew = sqlite3DbRealloc(db, pList,
       sizeof(*pList)+(pList->nAlloc-1)*sizeof(pList->a[0]));
  if( pNew==0 ){
    sqlite3ExprListDelete(db, pList);
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }else{
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}